

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inference.cpp
# Opt level: O3

bool __thiscall Kernel::Inference::hasNext(Inference *this,Iterator *it)

{
  bool bVar1;
  
  if ((undefined1  [48])((undefined1  [48])*this & (undefined1  [48])0x3) == (undefined1  [48])0x0)
  {
    if ((it->field_0).integer == 2) {
      return false;
    }
    if ((it->field_0).integer == 1) {
      bVar1 = this->_ptr2 == (void *)0x0;
    }
    else {
      bVar1 = this->_ptr1 == (void *)0x0;
    }
  }
  else {
    bVar1 = (it->field_0).pointer == (void *)0x0;
  }
  return !bVar1;
}

Assistant:

bool Inference::hasNext(Iterator& it) const
{
  switch(_kind) {
    case Kind::INFERENCE_012:
      switch(it.integer) {
      case 0:
        return (_ptr1 != nullptr);
      case 1:
        return (_ptr2 != nullptr);
      case 2:
        return false;
      default:
        ASSERTION_VIOLATION;
        return false;
      }
      break;
    case Kind::INFERENCE_MANY:
    case Kind::INFERENCE_FROM_SAT_REFUTATION:
      return (it.pointer != nullptr);
    default:
      ASSERTION_VIOLATION;
  }
}